

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionRewind.h
# Opt level: O2

void __thiscall Hpipe::InstructionRewind::~InstructionRewind(InstructionRewind *this)

{
  ~InstructionRewind(this);
  operator_delete(this,0x260);
  return;
}

Assistant:

CodeSeqItem( unsigned offset, InstructionWithCode *code ) : offset( offset ), code( code ) {}